

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::BlockChecked(ValidationSignals *this,CBlock *block,BlockValidationState *state)

{
  long lVar1;
  bool bVar2;
  ValidationSignalsImpl *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_000000a0;
  char (*in_stack_000000b0) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  base_blob<256U> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff10;
  CBlockHeader *in_stack_ffffffffffffff18;
  anon_class_16_2_9e5b4f8d *in_stack_ffffffffffffff28;
  ValidationState<BlockValidationResult> *in_stack_ffffffffffffff38;
  ValidationSignalsImpl *flag;
  undefined8 in_stack_ffffffffffffff68;
  int source_line;
  ConstevalFormatString<3U> in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffc0;
  
  source_line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flag = in_RDI;
  bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff28 = (anon_class_16_2_9e5b4f8d *)&stack0xffffffffffffffb8;
    CBlockHeader::GetHash(in_stack_ffffffffffffff18);
    base_blob<256u>::ToString_abi_cxx11_(in_stack_ffffffffffffff00);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_(in_stack_ffffffffffffff38);
    in_stack_fffffffffffffef8 = 1;
    LogPrintFormatInternal<char[13],std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,source_line,(LogFlags)flag,
               in_stack_000000a0,in_stack_ffffffffffffffa8,in_stack_000000b0,in_stack_000000b8,
               in_stack_000000c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  ValidationSignalsImpl::
  Iterate<ValidationSignals::BlockChecked(CBlock_const&,BlockValidationState_const&)::__0>
            (in_RDI,in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::BlockChecked(const CBlock& block, const BlockValidationState& state) {
    LOG_EVENT("%s: block hash=%s state=%s", __func__,
              block.GetHash().ToString(), state.ToString());
    m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.BlockChecked(block, state); });
}